

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O3

bool __thiscall
iDynTree::KinDynComputations::generalizedBiasForces
          (KinDynComputations *this,FreeFloatingGeneralizedTorques *generalizedBiasForces)

{
  KinDynComputationsPrivateAttributes *pKVar1;
  KinDynComputationsPrivateAttributes *pKVar2;
  undefined1 auVar3 [16];
  double dVar4;
  Twist *bodyFixedVel;
  Rotation *inertial_R_body;
  SpatialAcc *this_00;
  undefined1 (*pauVar5) [16];
  JointPosDoubleArray *pJVar6;
  Wrench *pWVar7;
  long lVar8;
  Transform *pTVar9;
  Vector6 zeroBaseAcc;
  Wrench local_f8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  Transform local_60 [48];
  
  computeFwdKinematics(this);
  iDynTree::LinkWrenches::zero();
  zeroBaseAcc.m_data[4] = 0.0;
  zeroBaseAcc.m_data[5] = 0.0;
  zeroBaseAcc.m_data[2] = 0.0;
  zeroBaseAcc.m_data[3] = 0.0;
  zeroBaseAcc.m_data[0] = 0.0;
  zeroBaseAcc.m_data[1] = 0.0;
  pKVar1 = this->pimpl;
  if (pKVar1->m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION) {
    iDynTree::FreeFloatingPos::worldBasePos();
    local_88 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_80 = 0;
    uStack_78 = 0;
    local_70 = 0;
    iDynTree::Transform::inverse();
    pTVar9 = local_60;
    iDynTree::Transform::operator*(pTVar9,(SpatialAcc *)&local_f8);
    pKVar1 = this->pimpl;
  }
  else {
    if (pKVar1->m_frameVelRepr == BODY_FIXED_REPRESENTATION) {
      (pKVar1->m_invDynBaseAcc).super_SpatialMotionVector.
      super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[0] = 0.0;
      (pKVar1->m_invDynBaseAcc).super_SpatialMotionVector.
      super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[1] = 0.0;
      (pKVar1->m_invDynBaseAcc).super_SpatialMotionVector.
      super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[2] = 0.0;
      (pKVar1->m_invDynBaseAcc).super_SpatialMotionVector.
      super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[0] = 0.0;
      (pKVar1->m_invDynBaseAcc).super_SpatialMotionVector.
      super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[1] = 0.0;
      (pKVar1->m_invDynBaseAcc).super_SpatialMotionVector.
      super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[2] = 0.0;
      goto LAB_001139c6;
    }
    bodyFixedVel = (Twist *)iDynTree::FreeFloatingVel::baseVel();
    iDynTree::FreeFloatingPos::worldBasePos();
    inertial_R_body = (Rotation *)iDynTree::Transform::getRotation();
    pTVar9 = (Transform *)&local_f8;
    convertMixedAccelerationToBodyFixedAcceleration(&zeroBaseAcc,bodyFixedVel,inertial_R_body);
    pKVar1 = this->pimpl;
  }
  iDynTree::SpatialAcc::operator=(&pKVar1->m_invDynBaseAcc,(SpatialAcc *)pTVar9);
LAB_001139c6:
  pKVar1 = this->pimpl;
  this_00 = (SpatialAcc *)iDynTree::FreeFloatingAcc::baseAcc();
  iDynTree::SpatialAcc::operator=(this_00,&pKVar1->m_invDynBaseAcc);
  pKVar1 = this->pimpl;
  pauVar5 = (undefined1 (*) [16])iDynTree::FreeFloatingAcc::baseAcc();
  dVar4 = (pKVar1->m_invDynBaseAcc).super_SpatialMotionVector.
          super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[1] -
          (pKVar1->m_gravityAccInBaseLinkFrame).m_data[1];
  auVar3._8_4_ = SUB84(dVar4,0);
  auVar3._0_8_ = (pKVar1->m_invDynBaseAcc).super_SpatialMotionVector.
                 super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data
                 [0] - (pKVar1->m_gravityAccInBaseLinkFrame).m_data[0];
  auVar3._12_4_ = (int)((ulong)dVar4 >> 0x20);
  *pauVar5 = auVar3;
  *(double *)pauVar5[1] =
       (pKVar1->m_invDynBaseAcc).super_SpatialMotionVector.
       super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[2] -
       (pKVar1->m_gravityAccInBaseLinkFrame).m_data[2];
  iDynTree::FreeFloatingAcc::jointAcc();
  iDynTree::VectorDynSize::zero();
  pKVar1 = this->pimpl;
  iDynTree::ForwardAccKinematics
            (&pKVar1->m_robot_model,&pKVar1->m_traversal,&pKVar1->m_pos,&pKVar1->m_vel,
             &pKVar1->m_invDynGeneralizedProperAccs,&pKVar1->m_linkVel,
             &pKVar1->m_invDynLinkProperAccs);
  pKVar1 = this->pimpl;
  pJVar6 = (JointPosDoubleArray *)iDynTree::FreeFloatingPos::jointPos();
  pKVar2 = this->pimpl;
  iDynTree::RNEADynamicPhase
            (&pKVar1->m_robot_model,&pKVar1->m_traversal,pJVar6,&pKVar2->m_linkVel,
             &pKVar2->m_invDynLinkProperAccs,&pKVar2->m_invDynNetExtWrenches,
             &pKVar2->m_invDynInternalWrenches,generalizedBiasForces);
  pKVar1 = this->pimpl;
  pWVar7 = (Wrench *)iDynTree::FreeFloatingGeneralizedTorques::baseWrench();
  pKVar2 = this->pimpl;
  iDynTree::Traversal::getBaseLink();
  lVar8 = iDynTree::Link::getIndex();
  pTVar9 = (Transform *)iDynTree::LinkPositions::operator()(&pKVar2->m_linkPos,lVar8);
  KinDynComputationsPrivateAttributes::fromBodyFixedToUsedRepresentation
            (&local_f8,pKVar1,pWVar7,pTVar9);
  pWVar7 = (Wrench *)iDynTree::FreeFloatingGeneralizedTorques::baseWrench();
  iDynTree::Wrench::operator=(pWVar7,&local_f8);
  iDynTree::SpatialForceVector::~SpatialForceVector(&local_f8.super_SpatialForceVector);
  return true;
}

Assistant:

bool KinDynComputations::generalizedBiasForces(FreeFloatingGeneralizedTorques & generalizedBiasForces)
{
    // Needed for using pimpl->m_linkVel
    this->computeFwdKinematics();

    // The external wrenches need to be set to zero
    pimpl->m_invDynNetExtWrenches.zero();

    // The base acceleration is "zero" in the chosen representation,
    // but the "zero" in mixed means non-zero in body-fixed, and we should account for that
    Vector6 zeroBaseAcc;
    zeroBaseAcc.zero();
    if( pimpl->m_frameVelRepr == BODY_FIXED_REPRESENTATION )
    {
        fromEigen(pimpl->m_invDynBaseAcc,toEigen(zeroBaseAcc));
    }
    else if( pimpl->m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION )
    {
        pimpl->m_invDynBaseAcc = convertInertialAccelerationToBodyFixedAcceleration(zeroBaseAcc,pimpl->m_pos.worldBasePos());
    }
    else
    {
        assert(pimpl->m_frameVelRepr == MIXED_REPRESENTATION);
        pimpl->m_invDynBaseAcc = convertMixedAccelerationToBodyFixedAcceleration(zeroBaseAcc,
                                                                                 pimpl->m_vel.baseVel(),
                                                                                 pimpl->m_pos.worldBasePos().getRotation());
    }

    pimpl->m_invDynGeneralizedProperAccs.baseAcc() = pimpl->m_invDynBaseAcc;
    toEigen(pimpl->m_invDynGeneralizedProperAccs.baseAcc().getLinearVec3()) =
            toEigen(pimpl->m_invDynBaseAcc.getLinearVec3()) - toEigen(pimpl->m_gravityAccInBaseLinkFrame);
    pimpl->m_invDynGeneralizedProperAccs.jointAcc().zero();

    // Run inverse dynamics
    ForwardAccKinematics(pimpl->m_robot_model,
                         pimpl->m_traversal,
                         pimpl->m_pos,
                         pimpl->m_vel,
                         pimpl->m_invDynGeneralizedProperAccs,
                         pimpl->m_linkVel,
                         pimpl->m_invDynLinkProperAccs);

    RNEADynamicPhase(pimpl->m_robot_model,
                     pimpl->m_traversal,
                     pimpl->m_pos.jointPos(),
                     pimpl->m_linkVel,
                     pimpl->m_invDynLinkProperAccs,
                     pimpl->m_invDynNetExtWrenches,
                     pimpl->m_invDynInternalWrenches,
                     generalizedBiasForces);

    // Convert output base force
    generalizedBiasForces.baseWrench() = pimpl->fromBodyFixedToUsedRepresentation(generalizedBiasForces.baseWrench(),
                                                                           pimpl->m_linkPos(pimpl->m_traversal.getBaseLink()->getIndex()));

    return true;
}